

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-slicer.h
# Opt level: O0

bool __thiscall Slicer::buildDG(Slicer *this,bool compute_deps)

{
  byte bVar1;
  bool bVar2;
  byte in_SIL;
  raw_ostream *in_RDI;
  Slicer *in_stack_00000030;
  unique_ptr<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_>
  *in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe8;
  raw_ostream *this_00;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  bVar1 = in_SIL & 1;
  this_00 = in_RDI;
  dg::llvmdg::LLVMDependenceGraphBuilder::constructCFGOnly
            ((LLVMDependenceGraphBuilder *)
             CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
  std::unique_ptr<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_>::operator=
            ((unique_ptr<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_> *)
             in_RDI,in_stack_ffffffffffffffd8);
  bVar2 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_>
                      *)0x1986ca);
  if (bVar2) {
    if ((bVar1 & 1) != 0) {
      computeDependencies(in_stack_00000030);
    }
    bVar2 = true;
  }
  else {
    llvm::errs();
    llvm::raw_ostream::operator<<(this_00,(char *)CONCAT17(bVar1,in_stack_ffffffffffffffe8));
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool buildDG(bool compute_deps = false) {
        _dg = std::move(_builder.constructCFGOnly());

        if (!_dg) {
            llvm::errs() << "Building the dependence graph failed!\n";
            return false;
        }

        if (compute_deps)
            computeDependencies();

        return true;
    }